

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

void __thiscall
node::anon_unknown_2::ChainImpl::getTransactionAncestry
          (ChainImpl *this,uint256 *txid,size_t *ancestors,size_t *descendants,size_t *ancestorsize,
          CAmount *ancestorfees)

{
  long lVar1;
  CTxMemPool *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *descendants = 0;
  *ancestors = 0;
  this_00 = (this->m_node->mempool)._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  if (this_00 == (CTxMemPool *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CTxMemPool::GetTransactionAncestry(this_00,txid,ancestors,descendants,ancestorsize,ancestorfees)
    ;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void getTransactionAncestry(const uint256& txid, size_t& ancestors, size_t& descendants, size_t* ancestorsize, CAmount* ancestorfees) override
    {
        ancestors = descendants = 0;
        if (!m_node.mempool) return;
        m_node.mempool->GetTransactionAncestry(txid, ancestors, descendants, ancestorsize, ancestorfees);
    }